

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void destringify(char *repr,VARR_char *to)

{
  size_t sVar1;
  int local_20;
  uint local_1c;
  int repr_len;
  int i;
  VARR_char *to_local;
  char *repr_local;
  
  sVar1 = strlen(repr);
  local_20 = (int)sVar1;
  VARR_chartrunc(to,0);
  if ((local_20 != 0) && ((local_1c = (uint)(*repr == '\"'), local_1c != 1 || (local_20 != 1)))) {
    if (repr[local_20 + -1] == '\"') {
      local_20 = local_20 + -1;
    }
    for (; (int)local_1c < local_20; local_1c = local_1c + 1) {
      if (((repr[(int)local_1c] != '\\') || (local_20 <= (int)(local_1c + 1))) ||
         ((repr[(int)(local_1c + 1)] != '\\' && (repr[(int)(local_1c + 1)] != '\"')))) {
        VARR_charpush(to,repr[(int)local_1c]);
      }
    }
  }
  return;
}

Assistant:

static void destringify (const char *repr, VARR (char) * to) {
  int i, repr_len = (int) strlen (repr);

  VARR_TRUNC (char, to, 0);
  if (repr_len == 0) return;
  i = repr[0] == '"' ? 1 : 0;
  if (i == 1 && repr_len == 1) return;
  if (repr[repr_len - 1] == '"') repr_len--;
  for (; i < repr_len; i++)
    if (repr[i] != '\\' || i + 1 >= repr_len || (repr[i + 1] != '\\' && repr[i + 1] != '"'))
      VARR_PUSH (char, to, repr[i]);
}